

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CLI::detail::split_up
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *str)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  long lVar4;
  iterator iVar5;
  iterator iVar6;
  reference pvVar7;
  bool bVar8;
  allocator local_1f9;
  string local_1f8;
  allocator local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string local_190;
  string local_170;
  allocator<char> local_149;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_148;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  string local_138 [39];
  allocator<char> local_111;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_108;
  undefined1 local_100 [8];
  string value;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  string local_98 [32];
  value_type local_78;
  long local_58;
  size_type end;
  char keyChar;
  bool embeddedQuote;
  anon_class_1_0_00000001_for__M_pred find_ws;
  allocator local_39;
  string local_38 [8];
  string delims;
  string *str_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *output;
  
  delims.field_2._8_8_ = str;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_38,"\'\"`",&local_39);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_39);
  trim(str);
  end._2_1_ = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  end._1_1_ = 0;
  end._0_1_ = ' ';
  while (bVar2 = ::std::__cxx11::string::empty(), ((bVar2 ^ 0xff) & 1) != 0) {
    pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
    lVar4 = ::std::__cxx11::string::find_first_of((char)local_38,(ulong)(uint)(int)*pcVar3);
    if (lVar4 == -1) {
      iVar5 = ::std::begin<std::__cxx11::string>(str);
      iVar6 = ::std::end<std::__cxx11::string>(str);
      local_c0 = ::std::
                 find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::split_up(std::__cxx11::string)::_lambda(char)_1_>
                           (iVar5._M_current,iVar6._M_current);
      value.field_2._8_8_ = ::std::end<std::__cxx11::string>(str);
      bVar8 = __gnu_cxx::operator!=
                        (&local_c0,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)((long)&value.field_2 + 8));
      if (bVar8) {
        local_108._M_current = (char *)::std::__cxx11::string::begin();
        local_110._M_current = local_c0._M_current;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  ((string *)local_100,local_108,local_110,&local_111);
        ::std::allocator<char>::~allocator(&local_111);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)local_100);
        local_140._M_current = local_c0._M_current;
        local_148._M_current = (char *)::std::__cxx11::string::end();
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::
        string<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                  (local_138,local_140,local_148,&local_149);
        ::std::__cxx11::string::operator=((string *)str,local_138);
        ::std::__cxx11::string::~string(local_138);
        ::std::allocator<char>::~allocator(&local_149);
        ::std::__cxx11::string::~string((string *)local_100);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,str);
        ::std::__cxx11::string::operator=((string *)str,"");
      }
    }
    else {
      pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
      end._0_1_ = *pcVar3;
      local_58 = ::std::__cxx11::string::find_first_of((char)str,(ulong)(uint)(int)(char)end);
      while( true ) {
        bVar8 = false;
        if (local_58 != -1) {
          pcVar3 = (char *)::std::__cxx11::string::operator[]((ulong)str);
          bVar8 = *pcVar3 == '\\';
        }
        if (!bVar8) break;
        local_58 = ::std::__cxx11::string::find_first_of((char)str,(ulong)(uint)(int)(char)end);
        end._1_1_ = 1;
      }
      if (local_58 == -1) {
        ::std::__cxx11::string::substr((ulong)&it,(ulong)str);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,(value_type *)&it);
        ::std::__cxx11::string::~string((string *)&it);
        ::std::__cxx11::string::operator=((string *)str,"");
      }
      else {
        ::std::__cxx11::string::substr((ulong)&local_78,(ulong)str);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(__return_storage_ptr__,&local_78);
        ::std::__cxx11::string::~string((string *)&local_78);
        ::std::__cxx11::string::substr((ulong)local_98,(ulong)str);
        ::std::__cxx11::string::operator=((string *)str,local_98);
        ::std::__cxx11::string::~string(local_98);
      }
    }
    if ((end._1_1_ & 1) != 0) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(__return_storage_ptr__);
      ::std::__cxx11::string::string((string *)&local_190,(string *)pvVar7);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_1d0,"\\",&local_1d1);
      ::std::operator+(&local_1b0,&local_1d0,(char)end);
      cVar1 = (char)end;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_1f8,1,cVar1,&local_1f9);
      find_and_replace(&local_170,&local_190,&local_1b0,&local_1f8);
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::back(__return_storage_ptr__);
      ::std::__cxx11::string::operator=((string *)pvVar7,(string *)&local_170);
      ::std::__cxx11::string::~string((string *)&local_170);
      ::std::__cxx11::string::~string((string *)&local_1f8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
      ::std::__cxx11::string::~string((string *)&local_1b0);
      ::std::__cxx11::string::~string((string *)&local_1d0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
      ::std::__cxx11::string::~string((string *)&local_190);
      end._1_1_ = 0;
    }
    trim(str);
  }
  end._2_1_ = 1;
  ::std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<std::string> split_up(std::string str) {

    const std::string delims("\'\"`");
    auto find_ws = [](char ch) { return std::isspace<char>(ch, std::locale()); };
    trim(str);

    std::vector<std::string> output;
    bool embeddedQuote = false;
    char keyChar = ' ';
    while(!str.empty()) {
        if(delims.find_first_of(str[0]) != std::string::npos) {
            keyChar = str[0];
            auto end = str.find_first_of(keyChar, 1);
            while((end != std::string::npos) && (str[end - 1] == '\\')) { // deal with escaped quotes
                end = str.find_first_of(keyChar, end + 1);
                embeddedQuote = true;
            }
            if(end != std::string::npos) {
                output.push_back(str.substr(1, end - 1));
                str = str.substr(end + 1);
            } else {
                output.push_back(str.substr(1));
                str = "";
            }
        } else {
            auto it = std::find_if(std::begin(str), std::end(str), find_ws);
            if(it != std::end(str)) {
                std::string value = std::string(str.begin(), it);
                output.push_back(value);
                str = std::string(it, str.end());
            } else {
                output.push_back(str);
                str = "";
            }
        }
        // transform any embedded quotes into the regular character
        if(embeddedQuote) {
            output.back() = find_and_replace(output.back(), std::string("\\") + keyChar, std::string(1, keyChar));
            embeddedQuote = false;
        }
        trim(str);
    }
    return output;
}